

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkAndJumpListHandler.cpp
# Opt level: O3

void __thiscall
ShellLinkAndJumpListHandler::ShellLinkAndJumpListHandler
          (ShellLinkAndJumpListHandler *this,string *filePath)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  long *plVar4;
  ReadStream *this_00;
  string local_40;
  
  *(undefined8 *)((long)&this->countOfShellLink + 1) = 0;
  this->countOfShellLinkWithErrors = 0;
  this->countOfShellLink = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"File:                               ",0x24);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(filePath->_M_dataplus)._M_p,filePath->_M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  this_00 = (ReadStream *)operator_new(0x210);
  pcVar1 = (filePath->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + filePath->_M_string_length);
  ReadStream::ReadStream(this_00,&local_40);
  this->rs = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    this_00 = this->rs;
  }
  bVar2 = ReadStream::isFileOpen(this_00);
  if (bVar2) {
    this->fileIsOpen = true;
  }
  return;
}

Assistant:

ShellLinkAndJumpListHandler::ShellLinkAndJumpListHandler(std::string filePath) {
    cout << "File:                               " << filePath << endl << endl;
    rs = new ReadStream(filePath);
    if(rs->isFileOpen())
        fileIsOpen = true;
}